

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

Vector<float,_2> __thiscall tcu::Vector<float,_4>::toWidth<2>(Vector<float,_4> *this)

{
  Vector<float,_2> VVar1;
  long lVar2;
  Vector<float,_2> *res;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float in_XMM0_Db;
  
  *in_RDI = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    in_XMM0_Da = this->m_data[lVar2];
    in_XMM0_Db = 0.0;
    *(float *)((long)in_RDI + lVar2 * 4) = in_XMM0_Da;
  }
  VVar1.m_data[1] = in_XMM0_Db;
  VVar1.m_data[0] = in_XMM0_Da;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}